

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::SetWellKnownHostTypeId
          (ThreadContext *this,WellKnownHostType wellKnownType,TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  DebugManager *this_00;
  ThreadContext *_pThreadContext;
  TrackAllocData TStack_70;
  ulong uStack_48;
  ulong uStack_40;
  ThreadContext *pTStack_38;
  undefined1 *puStack_30;
  
  if (1 < (int)wellKnownType) {
    AssertCount = AssertCount + 1;
    puStack_30 = (undefined1 *)0x7bc83c;
    Js::Throw::LogAssert();
    puStack_30 = (undefined1 *)0x7bc84c;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    puStack_30 = (undefined1 *)0x7bc874;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8cc,"(wellKnownType <= WellKnownHostType_Last)",
                       "ThreadContext::SetWellKnownHostTypeId called on unknown type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (wellKnownType < WellKnownHostType_Invalid) {
    (this->super_ThreadContextInfo).wellKnownHostTypeIds[wellKnownType] = typeId;
    _pThreadContext = (ThreadContext *)this->m_remoteThreadContextInfo;
    if (wellKnownType == WellKnownHostType_HTMLAllCollection &&
        _pThreadContext != (ThreadContext *)0x0) {
      puStack_30 = (undefined1 *)0x7bc8b7;
      SetWellKnownHostTypeId();
      uStack_48 = (ulong)typeId;
      uStack_40 = (ulong)wellKnownType;
      pTStack_38 = this;
      puStack_30 = &stack0xfffffffffffffff8;
      if (_pThreadContext->debugManager == (DebugManager *)0x0) {
        TStack_70.typeinfo = (type_info *)&Js::DebugManager::typeinfo;
        TStack_70.plusSize = 0;
        TStack_70.count = 0xffffffffffffffff;
        TStack_70.filename =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
        ;
        TStack_70.line = 0x8e1;
        puStack_30 = &stack0xfffffffffffffff8;
        alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&TStack_70);
        this_00 = (DebugManager *)new<Memory::HeapAllocator>(0x218,alloc,0x300d4a);
        Js::DebugManager::DebugManager
                  (this_00,_pThreadContext,_pThreadContext->allocationPolicyManager);
        _pThreadContext->debugManager = this_00;
      }
      LOCK();
      _pThreadContext->crefSContextForDiag = _pThreadContext->crefSContextForDiag + 1;
      UNLOCK();
      if (_pThreadContext->debugManager == (DebugManager *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x8e4,"(this->debugManager != nullptr)","this->debugManager != nullptr")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      return;
    }
  }
  return;
}

Assistant:

void ThreadContext::SetWellKnownHostTypeId(WellKnownHostType wellKnownType, Js::TypeId typeId)
{
    AssertMsg(wellKnownType <= WellKnownHostType_Last, "ThreadContext::SetWellKnownHostTypeId called on unknown type");

    if (wellKnownType >= 0 && wellKnownType <= WellKnownHostType_Last)
    {
        this->wellKnownHostTypeIds[wellKnownType] = typeId;
#if ENABLE_NATIVE_CODEGEN
        // The jit server really only needs to know about WellKnownHostType_HTMLAllCollection
        if (this->m_remoteThreadContextInfo && wellKnownType == WellKnownHostType_HTMLAllCollection)
        {
            HRESULT hr = JITManager::GetJITManager()->SetWellKnownHostTypeId(this->m_remoteThreadContextInfo, (int)typeId);
            JITManager::HandleServerCallResult(hr, RemoteCallType::StateUpdate);
        }
#endif
    }
}